

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<IntBoundCheckCompatibilityId,IntBoundCheck,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<IntBoundCheckCompatibilityId,IntBoundCheck,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<IntBoundCheckCompatibilityId,IntBoundCheck,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,IntBoundCheckCompatibilityId *key,IntBoundCheck *value)

{
  Type *pTVar1;
  long lVar2;
  Type pSVar3;
  Type piVar4;
  code *pcVar5;
  Instr *pIVar6;
  ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck> *pIVar7;
  ValueNumber VVar8;
  BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar9;
  int iVar10;
  undefined4 *puVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  IntBoundCheck *pIVar15;
  IntBoundCheckCompatibilityId local_50;
  IntBoundCheck *local_48;
  BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_40;
  uint local_38;
  hash_t local_34;
  
  lVar14 = *(long *)this;
  local_48 = value;
  if (lVar14 == 0) {
    BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  local_34 = BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             ::GetHashCodeWithKey<IntBoundCheckCompatibilityId>(key);
  local_38 = BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             ::GetBucket((BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                          *)this,local_34);
  lVar2 = *(long *)(this + 8);
  uVar13 = 0;
  local_40 = (BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *)this;
  for (pIVar15 = (IntBoundCheck *)(lVar14 + (ulong)local_38 * 4); this_00 = local_40,
      -1 < (long)(int)pIVar15->leftValueNumber; pIVar15 = pIVar15 + 1) {
    pIVar15 = (IntBoundCheck *)((long)(int)pIVar15->leftValueNumber * 0x20 + lVar2);
    local_50 = IntBoundCheck::CompatibilityId(pIVar15);
    bVar9 = IntBoundCheckCompatibilityId::operator==(&local_50,key);
    if (bVar9) {
      if (local_40->stats == (DictionaryStats *)0x0) {
        return -1;
      }
      DictionaryStats::Lookup(local_40->stats,uVar13);
      return -1;
    }
    uVar13 = uVar13 + 1;
  }
  if (local_40->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_40->stats,uVar13);
  }
  uVar13 = local_38;
  if (this_00->freeCount == 0) {
    iVar10 = this_00->size;
    iVar12 = this_00->count;
    if (iVar12 == iVar10) {
      BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Resize(this_00);
      uVar13 = BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ::GetBucket(this_00,local_34);
      iVar10 = this_00->size;
      iVar12 = this_00->count;
    }
    this_00->count = iVar12 + 1;
    if (iVar10 < iVar12 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar9) goto LAB_0045b4a9;
      *puVar11 = 0;
      iVar10 = this_00->size;
    }
    if (iVar10 <= iVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar9) goto LAB_0045b4a9;
      *puVar11 = 0;
    }
  }
  else {
    if (this_00->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar9) goto LAB_0045b4a9;
      *puVar11 = 0;
    }
    iVar12 = this_00->freeList;
    if (iVar12 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar9) goto LAB_0045b4a9;
      *puVar11 = 0;
      iVar12 = this_00->freeList;
    }
    if (this_00->count <= iVar12) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar9) {
LAB_0045b4a9:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
      iVar12 = this_00->freeList;
    }
    pTVar1 = &this_00->freeCount;
    *pTVar1 = *pTVar1 + -1;
    if (*pTVar1 != 0) {
      iVar10 = BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ::GetNextFreeEntryIndex(this_00->entries + iVar12);
      this_00->freeList = iVar10;
    }
  }
  pSVar3 = this_00->entries;
  pSVar3[iVar12].
  super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  .super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>.
  super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>.
  super_ValueEntryData<IntBoundCheck>.value.block = local_48->block;
  VVar8 = local_48->rightValueNumber;
  pIVar6 = local_48->instr;
  pSVar3 = pSVar3 + iVar12;
  pIVar7 = &(pSVar3->
            super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            ).super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>;
  (pIVar7->
  super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>).
  super_ValueEntryData<IntBoundCheck>.value.leftValueNumber = local_48->leftValueNumber;
  (pIVar7->
  super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>).
  super_ValueEntryData<IntBoundCheck>.value.rightValueNumber = VVar8;
  (pSVar3->
  super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  ).super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>.
  super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>.
  super_ValueEntryData<IntBoundCheck>.value.instr = pIVar6;
  piVar4 = this_00->buckets;
  pSVar3 = this_00->entries;
  pSVar3[iVar12].
  super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  .super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>.
  super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>.
  super_ValueEntryData<IntBoundCheck>.next = piVar4[uVar13];
  piVar4[uVar13] = iVar12;
  uVar13 = 0;
  iVar10 = iVar12;
  do {
    iVar10 = pSVar3[iVar10].
             super_DefaultHashedEntry<IntBoundCheckCompatibilityId,_IntBoundCheck,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
             .super_ImplicitKeyValueEntry<IntBoundCheckCompatibilityId,_IntBoundCheck>.
             super_ValueEntry<IntBoundCheck,_JsUtil::(anonymous_namespace)::ValueEntryData<IntBoundCheck>_>
             .super_ValueEntryData<IntBoundCheck>.next;
    uVar13 = uVar13 + 1;
  } while (iVar10 != -1);
  if (this_00->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this_00->stats,uVar13);
  }
  return iVar12;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }